

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_manager.cpp
# Opt level: O2

AdbcStatusCode
AdbcConnectionReadPartition
          (AdbcConnection *connection,uint8_t *serialized_partition,size_t serialized_length,
          ArrowArrayStream *out,AdbcError *error)

{
  _func_AdbcStatusCode_AdbcConnection_ptr_uint8_t_ptr_size_t_ArrowArrayStream_ptr_AdbcError_ptr
  *UNRECOVERED_JUMPTABLE;
  AdbcStatusCode AVar1;
  
  if (connection->private_driver == (AdbcDriver *)0x0) {
    AVar1 = '\x06';
  }
  else {
    UNRECOVERED_JUMPTABLE = connection->private_driver->ConnectionReadPartition;
    if (out == (ArrowArrayStream *)0x0) {
      AVar1 = (*UNRECOVERED_JUMPTABLE)
                        (connection,serialized_partition,serialized_length,(ArrowArrayStream *)0x0,
                         error);
      return AVar1;
    }
    AVar1 = (*UNRECOVERED_JUMPTABLE)(connection,serialized_partition,serialized_length,out,error);
    ErrorArrayStreamInit(out,connection->private_driver);
  }
  return AVar1;
}

Assistant:

AdbcStatusCode AdbcConnectionReadPartition(struct AdbcConnection *connection, const uint8_t *serialized_partition,
                                           size_t serialized_length, struct ArrowArrayStream *out,
                                           struct AdbcError *error) {
	if (!connection->private_driver) {
		return ADBC_STATUS_INVALID_STATE;
	}
	INIT_ERROR(error, connection);
	WRAP_STREAM(connection->private_driver->ConnectionReadPartition(connection, serialized_partition, serialized_length,
	                                                                out, error),
	            out, connection);
}